

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thrift_tools.hpp
# Opt level: O3

void __thiscall
duckdb::ReadAheadBuffer::AddReadHead
          (ReadAheadBuffer *this,idx_t pos,uint64_t len,bool merge_buffers)

{
  BufferHandle *this_00;
  ulong *puVar1;
  ulong uVar2;
  _List_node_base *p_Var3;
  long lVar4;
  _List_node_base *p_Var5;
  iterator iVar6;
  idx_t iVar7;
  runtime_error *this_01;
  long *plVar8;
  undefined7 in_register_00000009;
  size_type *psVar9;
  key_type pRVar10;
  ulong uVar11;
  ReadHead new_read_head;
  undefined1 local_1a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  ReadHead local_148;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((int)CONCAT71(in_register_00000009,merge_buffers) != 0) {
    this_00 = &local_148.buffer_handle;
    local_148.location = pos;
    local_148.size = len;
    BufferHandle::BufferHandle(this_00);
    local_148.data_isset = false;
    local_1a8._0_8_ = &local_148;
    iVar6 = ::std::
            _Rb_tree<duckdb::ReadHead_*,_duckdb::ReadHead_*,_std::_Identity<duckdb::ReadHead_*>,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_>
            ::find(&(this->merge_set)._M_t,(key_type *)local_1a8);
    if ((_Rb_tree_header *)iVar6._M_node != &(this->merge_set)._M_t._M_impl.super__Rb_tree_header) {
      puVar1 = *(ulong **)(iVar6._M_node + 1);
      uVar2 = *puVar1;
      iVar7 = local_148.location;
      if (uVar2 < local_148.location) {
        iVar7 = uVar2;
      }
      uVar11 = local_148.location + local_148.size;
      if (local_148.location + local_148.size < uVar2 + puVar1[1]) {
        uVar11 = uVar2 + puVar1[1];
      }
      *puVar1 = iVar7;
      puVar1[1] = uVar11 - iVar7;
      BufferHandle::~BufferHandle(this_00);
      return;
    }
    BufferHandle::~BufferHandle(this_00);
  }
  local_148.location = pos;
  local_148.size = len;
  BufferHandle::BufferHandle(&local_148.buffer_handle);
  local_148.data_isset = false;
  ::std::__cxx11::list<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>::
  _M_insert<duckdb::ReadHead>
            (&this->read_heads,
             (this->read_heads).
             super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node.
             super__List_node_base._M_next,&local_148);
  BufferHandle::~BufferHandle(&local_148.buffer_handle);
  this->total_size = this->total_size + len;
  p_Var3 = (this->read_heads).super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (merge_buffers) {
    local_148.location = (idx_t)(p_Var3 + 1);
    ::std::
    _Rb_tree<duckdb::ReadHead*,duckdb::ReadHead*,std::_Identity<duckdb::ReadHead*>,duckdb::ReadHeadComparator,std::allocator<duckdb::ReadHead*>>
    ::_M_insert_unique<duckdb::ReadHead*>
              ((_Rb_tree<duckdb::ReadHead*,duckdb::ReadHead*,std::_Identity<duckdb::ReadHead*>,duckdb::ReadHeadComparator,std::allocator<duckdb::ReadHead*>>
                *)&this->merge_set,(ReadHead **)&local_148);
  }
  lVar4 = (long)p_Var3[1]._M_next;
  p_Var5 = *(_List_node_base **)((long)(p_Var3 + 1) + 8);
  iVar7 = CachingFileHandle::GetFileSize(this->file_handle);
  if ((ulong)((long)&p_Var5->_M_next + lVar4) <= iVar7) {
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  CachingFileHandle::GetPath_abi_cxx11_(&local_110,this->file_handle);
  ::std::operator+(&local_90,"Prefetch registered for bytes outside file: ",&local_110);
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_90);
  local_188._M_dataplus._M_p = (pointer)*plVar8;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_188._M_dataplus._M_p == psVar9) {
    local_188.field_2._M_allocated_capacity = *psVar9;
    local_188.field_2._8_8_ = plVar8[3];
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  }
  else {
    local_188.field_2._M_allocated_capacity = *psVar9;
  }
  local_188._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::to_string(&local_b0,pos);
  ::std::operator+(&local_70,&local_188,&local_b0);
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_70);
  local_168._M_dataplus._M_p = (pointer)*plVar8;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_168._M_dataplus._M_p == psVar9) {
    local_168.field_2._M_allocated_capacity = *psVar9;
    local_168.field_2._8_8_ = plVar8[3];
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar9;
  }
  local_168._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::to_string
            (&local_d0,
             (long)&(*(_List_node_base **)((long)(p_Var3 + 1) + 8))->_M_next +
             (long)p_Var3[1]._M_next);
  ::std::operator+(&local_50,&local_168,&local_d0);
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_50);
  local_1a8._0_8_ = *plVar8;
  pRVar10 = (key_type)(plVar8 + 2);
  if ((key_type)local_1a8._0_8_ == pRVar10) {
    local_1a8._16_8_ = pRVar10->location;
    local_1a8._24_8_ = plVar8[3];
    local_1a8._0_8_ = (key_type)(local_1a8 + 0x10);
  }
  else {
    local_1a8._16_8_ = pRVar10->location;
  }
  local_1a8._8_8_ = plVar8[1];
  *plVar8 = (long)pRVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  iVar7 = CachingFileHandle::GetFileSize(this->file_handle);
  std::__cxx11::to_string(&local_f0,iVar7);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   &local_f0);
  ::std::runtime_error::runtime_error(this_01,(string *)&local_148);
  __cxa_throw(this_01,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void AddReadHead(idx_t pos, uint64_t len, bool merge_buffers = true) {
		// Attempt to merge with existing
		if (merge_buffers) {
			ReadHead new_read_head {pos, len};
			auto lookup_set = merge_set.find(&new_read_head);
			if (lookup_set != merge_set.end()) {
				auto existing_head = *lookup_set;
				auto new_start = MinValue<idx_t>(existing_head->location, new_read_head.location);
				auto new_length = MaxValue<idx_t>(existing_head->GetEnd(), new_read_head.GetEnd()) - new_start;
				existing_head->location = new_start;
				existing_head->size = new_length;
				return;
			}
		}

		read_heads.emplace_front(ReadHead(pos, len));
		total_size += len;
		auto &read_head = read_heads.front();

		if (merge_buffers) {
			merge_set.insert(&read_head);
		}

		if (read_head.GetEnd() > file_handle.GetFileSize()) {
			throw std::runtime_error("Prefetch registered for bytes outside file: " + file_handle.GetPath() +
			                         ", attempted range: [" + std::to_string(pos) + ", " +
			                         std::to_string(read_head.GetEnd()) +
			                         "), file size: " + std::to_string(file_handle.GetFileSize()));
		}
	}